

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_AddItemToArray(cJSON *array,cJSON *item)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  
  if (array != (cJSON *)0x0 && item != (cJSON *)0x0) {
    pcVar1 = array->child;
    if (array->child == (cJSON *)0x0) {
      array->child = item;
      return;
    }
    do {
      pcVar2 = pcVar1;
      pcVar1 = pcVar2->next;
    } while (pcVar2->next != (cJSON *)0x0);
    pcVar2->next = item;
    item->prev = pcVar2;
  }
  return;
}

Assistant:

static cJSON_bool add_item_to_array(cJSON *array, cJSON *item)
{
    cJSON *child = NULL;

    if ((item == NULL) || (array == NULL))
    {
        return false;
    }

    child = array->child;

    if (child == NULL)
    {
        /* list is empty, start new one */
        array->child = item;
    }
    else
    {
        /* append to the end */
        while (child->next)
        {
            child = child->next;
        }
        suffix_object(child, item);
    }

    return true;
}